

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_ManPrepareCuts(Nf_Cut_t *pCuts,Nf_Man_t *p,int iObj,int fAddUnit)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  word wVar4;
  Nf_Cut_t *pMfCut;
  Nf_Cut_t *p_00;
  uint *puVar5;
  uint Lit;
  int iVar6;
  
  iVar2 = Vec_IntEntry(&p->vCutSets,iObj);
  if (iVar2 < 1) {
    Nf_CutCreateUnit(pCuts,iObj);
    iVar2 = 1;
  }
  else {
    piVar3 = Nf_ObjCutSet(p,iObj);
    puVar5 = (uint *)(piVar3 + 1);
    p_00 = pCuts;
    for (iVar6 = 0; iVar2 = *piVar3, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      p_00->Delay = 0;
      p_00->Flow = 0.0;
      Lit = *puVar5 >> 5 & 0x3ffffff;
      uVar1 = *(uint *)&p_00->field_0x10;
      *(uint *)&p_00->field_0x10 = uVar1 & 0xfc000000 | Lit;
      *(uint *)&p_00->field_0x10 = uVar1 & 0x4000000 | Lit | *puVar5 << 0x1b;
      wVar4 = Nf_CutGetSign((int *)(puVar5 + 1),*puVar5 & 0x1f);
      p_00->Sign = wVar4;
      iVar2 = Abc_Lit2Var(Lit);
      *(uint *)&p_00->field_0x10 =
           *(uint *)&p_00->field_0x10 & 0xfbffffff | (uint)(p->vTt2Match->nSize <= iVar2) << 0x1a;
      memcpy(p_00->pLeaves,puVar5 + 1,(ulong)((*puVar5 & 0x1f) << 2));
      p_00 = p_00 + 1;
      puVar5 = puVar5 + (ulong)(*puVar5 & 0x1f) + 1;
    }
    if ((fAddUnit != 0) && (0xfffffff < *(uint *)&pCuts->field_0x10)) {
      Nf_CutCreateUnit(p_00,iObj);
      iVar2 = iVar2 + 1;
    }
  }
  return iVar2;
}

Assistant:

static inline int Nf_ManPrepareCuts( Nf_Cut_t * pCuts, Nf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Nf_ObjHasCuts(p, iObj) )
    {
        Nf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Nf_ObjCutSet(p, iObj);
        Nf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Nf_CutFunc( pCut );
            pMfCut->nLeaves = Nf_CutSize( pCut );
            pMfCut->Sign    = Nf_CutGetSign( pCut+1, Nf_CutSize(pCut) );
            pMfCut->Useless = Nf_ObjCutUseless( p, Abc_Lit2Var(pMfCut->iFunc) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Nf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Nf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Nf_CutCreateUnit( pCuts, iObj );
}